

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall TPZFrontNonSym<double>::Compress(TPZFrontNonSym<double> *this)

{
  long lVar1;
  long *plVar2;
  int64_t iVar3;
  int64_t iVar4;
  double *pdVar5;
  long in_RDI;
  int64_t j;
  int64_t i;
  int64_t nfound;
  TPZStack<long,_10> from;
  int64_t in_stack_fffffffffffffe68;
  TPZFrontNonSym<double> *in_stack_fffffffffffffe70;
  long in_stack_fffffffffffffe78;
  TPZStack<long,_10> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe98;
  TPZManVector<long,_10> *in_stack_fffffffffffffea0;
  double dVar6;
  long local_90;
  long local_88;
  TPZVec<long> local_78 [3];
  
  TPZStack<long,_10>::TPZStack(in_stack_fffffffffffffe80);
  for (local_88 = 0; local_88 < *(long *)(in_RDI + 0xa0); local_88 = local_88 + 1) {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    if (*plVar2 != -1) {
      TPZStack<long,_10>::Push(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
  }
  iVar3 = TPZVec<long>::NElements(local_78);
  for (local_88 = 0; local_88 < iVar3; local_88 = local_88 + 1) {
    plVar2 = TPZVec<long>::operator[](local_78,local_88);
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),*plVar2);
    lVar1 = *plVar2;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar2 = lVar1;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),*plVar2);
    *plVar2 = local_88;
  }
  for (; iVar4 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10)), local_88 < iVar4;
      local_88 = local_88 + 1) {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_88);
    *plVar2 = -1;
  }
  iVar4 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  if (iVar3 + iVar4 != *(long *)(in_RDI + 0xa0)) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
  }
  *(int64_t *)(in_RDI + 0xa0) = iVar3;
  TPZManVector<int,_10>::Resize
            ((TPZManVector<int,_10> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  TPZManVector<long,_10>::Resize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  iVar4 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0xf8));
  if (iVar4 != 0) {
    for (local_90 = 0; local_90 < iVar3; local_90 = local_90 + 1) {
      for (local_88 = 0; local_88 < iVar3; local_88 = local_88 + 1) {
        TPZVec<long>::operator[](local_78,local_88);
        TPZVec<long>::operator[](local_78,local_90);
        pdVar5 = Element(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0x1d18a28);
        dVar6 = *pdVar5;
        pdVar5 = Element(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0x1d18a5b);
        *pdVar5 = dVar6;
        plVar2 = TPZVec<long>::operator[](local_78,local_88);
        if ((*plVar2 != local_88) ||
           (plVar2 = TPZVec<long>::operator[](local_78,local_90), *plVar2 != local_90)) {
          TPZVec<long>::operator[](local_78,local_88);
          TPZVec<long>::operator[](local_78,local_90);
          in_stack_fffffffffffffe70 =
               (TPZFrontNonSym<double> *)
               Element(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0x1d18b2c);
          (in_stack_fffffffffffffe70->super_TPZFront<double>).super_TPZSavable._vptr_TPZSavable =
               (_func_int **)0x0;
        }
      }
    }
  }
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1d18b8d);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress");
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//this->fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i < nfound; i++){
			Element(i,j) = Element(from[i], from[j]);
			if(from[i]!=i || from[j]!=j) Element(from[i],from[j])=0.;
		}
	}
}